

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestmassQuoteSetString::~TestmassQuoteSetString(TestmassQuoteSetString *this)

{
  TestmassQuoteSetString *this_local;
  
  ~TestmassQuoteSetString(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(massQuoteSetString)
{
  MassQuote object;

  DataDictionary dataDictionary( "../spec/FIX42.xml" );

  object.setString
    ( "8=FIX.4.2\0019=54\00135=i\001117=1\001296=1\001302=A\001"
      "311=DELL\001364=10\001365=DELL\001COMP\001\00110=152\001",
       true, &dataDictionary );

  QuoteID quoteID;

  object.get( quoteID );

  QuoteSetID quoteSetID;
  UnderlyingSymbol underlyingSymbol;
  EncodedUnderlyingSecurityDescLen encLen;
  EncodedUnderlyingSecurityDesc encDesc;

  MassQuote::NoQuoteSets group;
  object.getGroup( 1, group );
  group.get( quoteSetID );
  group.get( underlyingSymbol );
  group.get( encLen );
  group.get( encDesc );

  CHECK_EQUAL( "A", quoteSetID );
  CHECK_EQUAL( "DELL", underlyingSymbol );
  CHECK_EQUAL( 10, encLen );
  CHECK_EQUAL( "DELL\001COMP\001", encDesc );
}